

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

uint __thiscall
ON_Mesh::GetMeshFaceSideList(ON_Mesh *this,uint *Vid,ON_MeshFaceSide **face_side_list)

{
  uint uVar1;
  ulong mesh_vertex_count;
  ON_MeshFaceList mesh_face_list;
  ON_MeshFaceList OStack_38;
  
  mesh_vertex_count = (ulong)(uint)(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  uVar1 = 0;
  if (1 < mesh_vertex_count) {
    ON_MeshFaceList::ON_MeshFaceList(&OStack_38,this);
    if (OStack_38.m_face_count == 0) {
      uVar1 = 0;
    }
    else {
      uVar1 = ON_MeshFaceSide::GetFaceSideList
                        (mesh_vertex_count,&OStack_38,(uint *)0x0,0,Vid,face_side_list);
    }
  }
  return uVar1;
}

Assistant:

bool
ON_MeshFace::IsValid(int mesh_vertex_count) const
{
  return (vi[0] >= 0 && vi[0] < mesh_vertex_count
    && vi[1] >= 0 && vi[1] < mesh_vertex_count
    && vi[2] >= 0 && vi[2] < mesh_vertex_count
    && vi[3] >= 0 && vi[3] < mesh_vertex_count
    && vi[0] != vi[1] && vi[1] != vi[2] && vi[2] != vi[0]
    && (vi[2] == vi[3] || (vi[0] != vi[3] && vi[1] != vi[3])));
}